

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

void __thiscall Widget::writeXmlAttributes(Widget *this,stringstream *str)

{
  Anchor anchor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator local_311;
  string local_310;
  string local_2f0 [32];
  string local_2d0;
  string local_2b0 [32];
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0 [32];
  string local_1b0;
  string local_190 [32];
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_170,"type",&local_311);
  Util::writeXmlAttribute<int>(&local_30,str,&local_170,this->type);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string(local_190,"styleFile",&local_311);
  std::__cxx11::string::string((string *)&local_1b0,(string *)&this->stylefile);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_50,(Util *)str,(stringstream *)local_190,&local_1b0,in_R8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::string(local_1d0,"name",&local_311);
  std::__cxx11::string::string((string *)&local_1f0,(string *)&this->name);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_70,(Util *)str,(stringstream *)local_1d0,&local_1f0,in_R8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::string((string *)&local_210,"x",&local_311);
  Util::writeXmlAttribute<float>(&local_90,str,&local_210,this->x);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)&local_230,"y",&local_311);
  Util::writeXmlAttribute<float>(&local_b0,str,&local_230,this->y);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_250,"width",&local_311);
  Util::writeXmlAttribute<float>(&local_d0,str,&local_250,this->width);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string((string *)&local_270,"height",&local_311);
  Util::writeXmlAttribute<float>(&local_f0,str,&local_270,this->height);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string((string *)&local_290,"visible",&local_311);
  Util::writeXmlAttribute<bool>(&local_110,str,&local_290,this->visible);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string(local_2b0,"anchor",&local_311);
  Util::toString_abi_cxx11_(&local_2d0,(Util *)(ulong)this->anchor,anchor);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_130,(Util *)str,(stringstream *)local_2b0,&local_2d0,in_R8);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::string(local_2f0,"transform",&local_311);
  Transform::writeXmlAttribute_abi_cxx11_(&local_310,&this->transform);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_150,(Util *)str,(stringstream *)local_2f0,&local_310,in_R8);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string(local_2f0);
  return;
}

Assistant:

void Widget::writeXmlAttributes(std::stringstream &str) const
{
	Util::writeXmlAttribute(str, "type", type);
	Util::writeXmlAttribute(str, "styleFile", stylefile);
	Util::writeXmlAttribute(str, "name", name);
	Util::writeXmlAttribute(str, "x", x);
	Util::writeXmlAttribute(str, "y", y);
	Util::writeXmlAttribute(str, "width", width);
	Util::writeXmlAttribute(str, "height", height);
	Util::writeXmlAttribute(str, "visible", visible);
	Util::writeXmlAttribute(str, "anchor", Util::toString(anchor));
	Util::writeXmlAttribute(str, "transform", transform.writeXmlAttribute());
}